

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::WriteNinjaRequiredVersion(cmLocalNinjaGenerator *this,ostream *os)

{
  undefined8 os_00;
  bool bVar1;
  cmGlobalNinjaGenerator *pcVar2;
  cmake *this_00;
  ostream *poVar3;
  void *this_01;
  byte local_fa;
  allocator<char> local_d1;
  string local_d0;
  string local_b0 [37];
  byte local_8b;
  byte local_8a;
  allocator<char> local_89;
  string local_88;
  string local_68 [48];
  string local_38 [8];
  string requiredVersion;
  ostream *os_local;
  cmLocalNinjaGenerator *this_local;
  
  requiredVersion.field_2._8_8_ = os;
  cmGlobalNinjaGenerator::RequiredNinjaVersion_abi_cxx11_();
  pcVar2 = GetGlobalNinjaGenerator(this);
  bVar1 = cmGlobalNinjaGenerator::SupportsConsolePool(pcVar2);
  if (bVar1) {
    cmGlobalNinjaGenerator::RequiredNinjaVersionForConsolePool_abi_cxx11_();
    std::__cxx11::string::operator=(local_38,local_68);
    std::__cxx11::string::~string(local_68);
  }
  local_8a = 0;
  local_8b = 0;
  pcVar2 = GetGlobalNinjaGenerator(this);
  bVar1 = cmGlobalNinjaGenerator::SupportsManifestRestat(pcVar2);
  local_fa = 0;
  if (bVar1) {
    this_00 = GetCMakeInstance(this);
    bVar1 = cmake::DoWriteGlobVerifyTarget(this_00);
    local_fa = 0;
    if (bVar1) {
      pcVar2 = GetGlobalNinjaGenerator(this);
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"CMAKE_SUPPRESS_REGENERATION",&local_89);
      local_8b = 1;
      bVar1 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)pcVar2,&local_88);
      local_fa = bVar1 ^ 0xff;
    }
  }
  if ((local_8b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_8a & 1) != 0) {
    std::allocator<char>::~allocator(&local_89);
  }
  if ((local_fa & 1) != 0) {
    cmGlobalNinjaGenerator::RequiredNinjaVersionForManifestRestat_abi_cxx11_();
    std::__cxx11::string::operator=(local_38,local_b0);
    std::__cxx11::string::~string(local_b0);
  }
  os_00 = requiredVersion.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Minimal version of Ninja required by this file",&local_d1);
  cmGlobalNinjaGenerator::WriteComment((ostream *)os_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  poVar3 = std::operator<<((ostream *)requiredVersion.field_2._8_8_,"ninja_required_version = ");
  poVar3 = std::operator<<(poVar3,local_38);
  this_01 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaRequiredVersion(std::ostream& os)
{
  // Default required version
  std::string requiredVersion = cmGlobalNinjaGenerator::RequiredNinjaVersion();

  // Ninja generator uses the 'console' pool if available (>= 1.5)
  if (this->GetGlobalNinjaGenerator()->SupportsConsolePool()) {
    requiredVersion =
      cmGlobalNinjaGenerator::RequiredNinjaVersionForConsolePool();
  }

  // The Ninja generator writes rules which require support for restat
  // when rebuilding build.ninja manifest (>= 1.8)
  if (this->GetGlobalNinjaGenerator()->SupportsManifestRestat() &&
      this->GetCMakeInstance()->DoWriteGlobVerifyTarget() &&
      !this->GetGlobalNinjaGenerator()->GlobalSettingIsOn(
        "CMAKE_SUPPRESS_REGENERATION")) {
    requiredVersion =
      cmGlobalNinjaGenerator::RequiredNinjaVersionForManifestRestat();
  }

  cmGlobalNinjaGenerator::WriteComment(
    os, "Minimal version of Ninja required by this file");
  os << "ninja_required_version = " << requiredVersion << std::endl
     << std::endl;
}